

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::ShowPartList(BoardView *this,bool *p_open)

{
  int iVar1;
  PartList *in_RDI;
  Board *in_stack_00000088;
  bool *in_stack_00000090;
  char *in_stack_00000098;
  PartList *in_stack_000000a0;
  _Placeholder<1> *in_stack_ffffffffffffff78;
  TcharStringCallback *in_stack_ffffffffffffff90;
  KeyBindings *in_stack_ffffffffffffff98;
  PartList *this_00;
  
  if (ShowPartList(bool*)::partList == '\0') {
    iVar1 = __cxa_guard_acquire(&ShowPartList(bool*)::partList);
    if (iVar1 != 0) {
      this_00 = in_RDI;
      std::bind<void(BoardView::*)(char_const*),BoardView*,std::_Placeholder<1>const&>
                ((offset_in_BoardView_to_subr *)in_RDI,
                 (BoardView **)
                 ((long)&in_RDI[0x50c].cbNetSelected_.super__Function_base._M_functor + 8),
                 in_stack_ffffffffffffff78);
      std::function<void(char_const*)>::
      function<std::_Bind<void(BoardView::*(BoardView*,std::_Placeholder<1>))(char_const*)>,void>
                (in_stack_ffffffffffffff90,
                 (_Bind<void_(BoardView::*(BoardView_*,_std::_Placeholder<1>))(const_char_*)> *)
                 in_RDI);
      PartList::PartList(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)0x12bc51);
      __cxa_atexit(PartList::~PartList,&ShowPartList::partList,&__dso_handle);
      __cxa_guard_release(&ShowPartList(bool*)::partList);
    }
  }
  PartList::Draw(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void BoardView::ShowPartList(bool *p_open) {
	static PartList partList(keybindings, std::bind(&BoardView::FindComponent, this, std::placeholders::_1));
	partList.Draw("Part List", p_open, m_board);
}